

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

void parse_output_preds(options_i *options,vw *all)

{
  long *plVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *__file;
  long in_RSI;
  long *in_RDI;
  int f_1;
  char *t;
  int f;
  char *fstr;
  option_group_definition output_options;
  string raw_predictions;
  string predictions;
  undefined4 in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa4c;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffa50;
  undefined7 in_stack_fffffffffffffa58;
  undefined1 in_stack_fffffffffffffa5f;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffa98;
  option_group_definition *in_stack_fffffffffffffaa0;
  allocator local_4b1;
  string local_4b0 [39];
  allocator local_489;
  string local_488 [32];
  int local_468;
  int local_464;
  char *local_460;
  undefined4 local_458;
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [359];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [375];
  allocator local_a9;
  string local_a8 [32];
  undefined1 local_88 [56];
  string local_50 [32];
  string local_30 [32];
  long local_10;
  long *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"Output options",&local_a9);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffa50,
             (string *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"predictions",&local_221);
  VW::config::make_option<std::__cxx11::string>
            ((string *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"p",&local_249);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  short_name(in_stack_fffffffffffffa50,
             (string *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"File to output predictions to",&local_271);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_fffffffffffffa50,
       (string *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_fffffffffffffa50,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"raw_predictions",&local_3d9);
  VW::config::make_option<std::__cxx11::string>
            ((string *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"r",&local_401);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  short_name(in_stack_fffffffffffffa50,
             (string *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"File to output unnormalized predictions to",&local_429);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_fffffffffffffa50,
       (string *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_fffffffffffffa50,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_fffffffffffffa50);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_fffffffffffffa50);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_fffffffffffffa50);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_fffffffffffffa50);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  (**(code **)*local_8)(local_8,local_88);
  plVar1 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"predictions",&local_451);
  bVar2 = (**(code **)(*plVar1 + 8))(plVar1,local_450);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  if ((bVar2 & 1) != 0) {
    if ((*(byte *)(local_10 + 0x3439) & 1) == 0) {
      poVar5 = std::operator<<((ostream *)(local_10 + 0xe0),"predictions = ");
      poVar5 = std::operator<<(poVar5,local_30);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffa50,
                            (char *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    if (bVar3) {
      local_458 = 1;
      v_array<int>::push_back
                ((v_array<int> *)in_stack_fffffffffffffa50,
                 (int *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    }
    else {
      local_460 = (char *)std::__cxx11::string::c_str();
      local_464 = open64(local_460,0x241,0x1b6);
      if (local_464 < 0) {
        poVar5 = std::operator<<((ostream *)(local_10 + 0xe0),"Error opening the predictions file: "
                                );
        poVar5 = std::operator<<(poVar5,local_460);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      local_468 = local_464;
      v_array<int>::push_back
                ((v_array<int> *)in_stack_fffffffffffffa50,
                 (int *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    }
  }
  plVar1 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_488,"raw_predictions",&local_489);
  bVar2 = (**(code **)(*plVar1 + 8))(plVar1,local_488);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  if ((bVar2 & 1) != 0) {
    if ((*(byte *)(local_10 + 0x3439) & 1) == 0) {
      poVar5 = std::operator<<((ostream *)(local_10 + 0xe0),"raw predictions = ");
      poVar5 = std::operator<<(poVar5,local_50);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4b0,"binary",&local_4b1);
      bVar2 = (**(code **)(*local_8 + 8))(local_8,local_4b0);
      std::__cxx11::string::~string(local_4b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
      if ((bVar2 & 1) != 0) {
        in_stack_fffffffffffffa50 =
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)std::operator<<((ostream *)(local_10 + 0xe0),
                                "Warning: --raw_predictions has no defined value when --binary specified, expect no output"
                               );
        std::ostream::operator<<(in_stack_fffffffffffffa50,std::endl<char,std::char_traits<char>>);
      }
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffa50,
                            (char *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    if (bVar3) {
      *(undefined4 *)(local_10 + 0x3530) = 1;
    }
    else {
      __file = (char *)std::__cxx11::string::c_str();
      iVar4 = open64(__file,0x241,0x1b6);
      *(int *)(local_10 + 0x3530) = iVar4;
    }
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffa50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void parse_output_preds(options_i& options, vw& all)
{
  std::string predictions;
  std::string raw_predictions;

  option_group_definition output_options("Output options");
  output_options.add(make_option("predictions", predictions).short_name("p").help("File to output predictions to"))
      .add(make_option("raw_predictions", raw_predictions)
               .short_name("r")
               .help("File to output unnormalized predictions to"));
  options.add_and_parse(output_options);

  if (options.was_supplied("predictions"))
  {
    if (!all.quiet)
      all.trace_message << "predictions = " << predictions << endl;

    if (predictions == "stdout")
    {
      all.final_prediction_sink.push_back((size_t)1);  // stdout
    }
    else
    {
      const char* fstr = predictions.c_str();
      int f;
      // TODO can we migrate files to fstreams?
#ifdef _WIN32
      _sopen_s(&f, fstr, _O_CREAT | _O_WRONLY | _O_BINARY | _O_TRUNC, _SH_DENYWR, _S_IREAD | _S_IWRITE);
#else
      f = open(fstr, O_CREAT | O_WRONLY | O_LARGEFILE | O_TRUNC, 0666);
#endif
      if (f < 0)
        all.trace_message << "Error opening the predictions file: " << fstr << endl;
      all.final_prediction_sink.push_back((size_t)f);
    }
  }

  if (options.was_supplied("raw_predictions"))
  {
    if (!all.quiet)
    {
      all.trace_message << "raw predictions = " << raw_predictions << endl;
      if (options.was_supplied("binary"))
        all.trace_message << "Warning: --raw_predictions has no defined value when --binary specified, expect no output"
                          << endl;
    }
    if (raw_predictions == "stdout")
      all.raw_prediction = 1;  // stdout
    else
    {
      const char* t = raw_predictions.c_str();
      int f;
#ifdef _WIN32
      _sopen_s(&f, t, _O_CREAT | _O_WRONLY | _O_BINARY | _O_TRUNC, _SH_DENYWR, _S_IREAD | _S_IWRITE);
#else
      f = open(t, O_CREAT | O_WRONLY | O_LARGEFILE | O_TRUNC, 0666);
#endif
      all.raw_prediction = f;
    }
  }
}